

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O2

void __thiscall Node::key_t::key_t(key_t *this)

{
  allocator local_1a;
  allocator local_19;
  
  this->c = 0;
  std::__cxx11::string::string((string *)&this->o,"0",&local_19);
  this->t = 0;
  std::__cxx11::string::string((string *)&this->d,"0",&local_1a);
  return;
}

Assistant:

Node::key_t::key_t():c(0),o("0"),t(0),d("0"){}